

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_tokenizer.cc
# Opt level: O0

void __thiscall Finder::~Finder(Finder *this)

{
  Finder *this_local;
  
  ~Finder(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

~Finder() override = default;